

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall
TxConfirmStats::removeTx
          (TxConfirmStats *this,uint entryHeight,uint nBestSeenHeight,uint bucketindex,bool inBlock)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  pointer pvVar4;
  pointer piVar5;
  long lVar6;
  undefined1 auVar7 [16];
  string_view source_file;
  bool bVar8;
  Logger *pLVar9;
  pointer pvVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint *args_1;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  uint blockIndex;
  string log_msg;
  char *in_stack_ffffffffffffff00;
  uint *in_stack_ffffffffffffff08;
  undefined4 local_e4;
  uint local_e0 [26];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = nBestSeenHeight - entryHeight;
  if (nBestSeenHeight == 0) {
    uVar12 = 0;
  }
  local_e0[0] = bucketindex;
  if ((int)uVar12 < 0) {
    pLVar9 = LogInstance();
    bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar9,ESTIMATEFEE,Debug);
    if (bVar8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file_00._M_len = 0x58;
        logging_function._M_str = "removeTx";
        logging_function._M_len = 8;
        ::LogPrintf_<>(logging_function,source_file_00,0x1e8,ESTIMATEFEE,Debug,
                       "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;
      }
      goto LAB_00997f50;
    }
  }
  else {
    pvVar4 = (this->unconfTxs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    args_1 = (uint *)(((long)(this->unconfTxs).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                     -0x5555555555555555);
    uVar13 = (ulong)bucketindex;
    if ((int)uVar12 < (int)args_1) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = args_1;
      lVar11 = SUB168(ZEXT416(entryHeight) % auVar7,0);
      local_e4 = SUB164(ZEXT416(entryHeight) % auVar7,0);
      if (*(int *)(*(long *)&pvVar4[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + uVar13 * 4) < 1) {
        pLVar9 = LogInstance();
        bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar9,ESTIMATEFEE,Debug);
        if (bVar8) {
          pLVar9 = LogInstance();
          bVar8 = BCLog::Logger::Enabled(pLVar9);
          if (bVar8) {
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            tinyformat::format<unsigned_int,unsigned_int>
                      (&local_78,
                       (tinyformat *)
                       "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n"
                       ,(char *)&local_e4,local_e0,args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_58,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            pLVar9 = LogInstance();
            local_78._M_dataplus._M_p = &DAT_00000058;
            local_78._M_string_length = 0xfe4ab7;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
            ;
            source_file._M_len = 0x58;
            str._M_str = local_58._M_dataplus._M_p;
            str._M_len = local_58._M_string_length;
            logging_function_01._M_str = "removeTx";
            logging_function_01._M_len = 8;
            BCLog::Logger::LogPrintStr
                      (pLVar9,str,logging_function_01,source_file,0x1fa,ESTIMATEFEE,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
      else {
        piVar1 = (int *)(*(long *)&pvVar4[lVar11].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + uVar13 * 4);
        *piVar1 = *piVar1 + -1;
      }
    }
    else {
      piVar5 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar5[uVar13];
      if (iVar2 < 1) {
        pLVar9 = LogInstance();
        bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar9,ESTIMATEFEE,Debug);
        if (bVar8) {
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
          ;
          source_file_01._M_len = 0x58;
          logging_function_00._M_str = "removeTx";
          logging_function_00._M_len = 8;
          LogPrintf_<unsigned_int>
                    (logging_function_00,source_file_01,0x1f1,
                     IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|PRUNE|REINDEX|SELECTCOINS|ADDRMAN
                     |ESTIMATEFEE|RPC|HTTP|MEMPOOL|TOR|NET,(Level)local_e0,in_stack_ffffffffffffff00
                     ,in_stack_ffffffffffffff08);
        }
      }
      else {
        piVar5[uVar13] = iVar2 + -1;
      }
    }
    if ((!inBlock) && (uVar3 = this->scale, uVar3 <= uVar12)) {
      if (uVar3 == 0) {
        __assert_fail("scale != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                      ,0x1fe,
                      "void TxConfirmStats::removeTx(unsigned int, unsigned int, unsigned int, bool)"
                     );
      }
      if (uVar3 <= uVar12) {
        pvVar10 = (this->failAvg).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = (long)(this->failAvg).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10;
        uVar13 = 0;
        do {
          if ((lVar11 >> 3) * -0x5555555555555555 - uVar13 == 0) break;
          lVar6 = *(long *)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data;
          *(double *)(lVar6 + (ulong)local_e0[0] * 8) =
               *(double *)(lVar6 + (ulong)local_e0[0] * 8) + 1.0;
          uVar13 = uVar13 + 1;
          pvVar10 = pvVar10 + 1;
        } while (uVar13 < (ulong)uVar12 / (ulong)uVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00997f50:
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::removeTx(unsigned int entryHeight, unsigned int nBestSeenHeight, unsigned int bucketindex, bool inBlock)
{
    //nBestSeenHeight is not updated yet for the new block
    int blocksAgo = nBestSeenHeight - entryHeight;
    if (nBestSeenHeight == 0)  // the BlockPolicyEstimator hasn't seen any blocks yet
        blocksAgo = 0;
    if (blocksAgo < 0) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;  //This can't happen because we call this with our best seen height, no entries can have higher
    }

    if (blocksAgo >= (int)unconfTxs.size()) {
        if (oldUnconfTxs[bucketindex] > 0) {
            oldUnconfTxs[bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from >25 blocks,bucketIndex=%u already\n",
                     bucketindex);
        }
    }
    else {
        unsigned int blockIndex = entryHeight % unconfTxs.size();
        if (unconfTxs[blockIndex][bucketindex] > 0) {
            unconfTxs[blockIndex][bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n",
                     blockIndex, bucketindex);
        }
    }
    if (!inBlock && (unsigned int)blocksAgo >= scale) { // Only counts as a failure if not confirmed for entire period
        assert(scale != 0);
        unsigned int periodsAgo = blocksAgo / scale;
        for (size_t i = 0; i < periodsAgo && i < failAvg.size(); i++) {
            failAvg[i][bucketindex]++;
        }
    }
}